

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool EV_MovePolyTo(line_t *line,int polyNum,double speed,DVector2 *targ,bool overRide)

{
  bool bVar1;
  TVector2<double> *other;
  size_t len;
  TVector2<double> local_260;
  TVector2<double> local_250;
  TVector2<double> local_240;
  TVector2<double> local_230 [2];
  TVector2<double> local_210;
  undefined1 local_200 [8];
  FPolyMirrorIterator it;
  double distlen;
  DVector2 dist;
  FPolyObj *poly;
  DMovePolyTo *pe;
  bool overRide_local;
  DVector2 *targ_local;
  double speed_local;
  int polyNum_local;
  line_t *line_local;
  
  poly = (FPolyObj *)0x0;
  TVector2<double>::TVector2((TVector2<double> *)&distlen);
  dist.Y = (double)PO_GetPolyobj(polyNum);
  if ((FPolyObj *)dist.Y == (FPolyObj *)0x0) {
    Printf("EV_MovePolyTo: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
    line_local._7_1_ = false;
  }
  else {
    FPolyMirrorIterator::FPolyMirrorIterator((FPolyMirrorIterator *)local_200,(FPolyObj *)dist.Y);
    TVector2<double>::operator-(&local_210,targ);
    TVector2<double>::operator=((TVector2<double> *)&distlen,&local_210);
    it._408_8_ = TVector2<double>::MakeUnit((TVector2<double> *)&distlen);
    while (dist.Y = (double)FPolyMirrorIterator::NextMirror((FPolyMirrorIterator *)local_200),
          (FPolyObj *)dist.Y != (FPolyObj *)0x0) {
      len = 0;
      bVar1 = TObjPtr<DPolyAction>::operator!=
                        (&((FPolyObj *)dist.Y)->specialdata,(DPolyAction *)0x0);
      if (((bVar1) || ((*(byte *)((long)dist.Y + 0xc5) & 1) != 0)) && (!overRide)) break;
      poly = (FPolyObj *)DObject::operator_new((DObject *)0x78,len);
      DMovePolyTo::DMovePolyTo((DMovePolyTo *)poly,*(int *)((long)dist.Y + 0xa8));
      TObjPtr<DPolyAction>::operator=
                ((TObjPtr<DPolyAction> *)((long)dist.Y + 0xe0),(DPolyAction *)poly);
      *(undefined1 *)((long)dist.Y + 0xc5) = 0;
      *(undefined8 *)&(poly->PrevPts).Most = it._408_8_;
      (poly->PrevPts).Array = (FPolyVertex *)speed;
      operator*(local_230,speed);
      TVector2<double>::operator=
                ((TVector2<double> *)
                 ((anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 *)&(poly->StartSpot).pos +
                 1),local_230);
      other = (TVector2<double> *)((long)dist.Y + 0x50);
      operator*(&local_250,(double)it._408_8_);
      TVector2<double>::operator+(&local_240,other);
      TVector2<double>::operator=((TVector2<double> *)&(poly->CenterSpot).pos.Y,&local_240);
      if (*(double *)&(poly->PrevPts).Most / (double)(poly->PrevPts).Array <= 2.0) {
        DPolyAction::StopInterpolation((DPolyAction *)poly);
      }
      TVector2<double>::operator-(&local_260);
      TVector2<double>::operator=((TVector2<double> *)&distlen,&local_260);
    }
    line_local._7_1_ = poly != (FPolyObj *)0x0;
  }
  return line_local._7_1_;
}

Assistant:

bool EV_MovePolyTo(line_t *line, int polyNum, double speed, const DVector2 &targ, bool overRide)
{
	DMovePolyTo *pe = NULL;
	FPolyObj *poly;
	DVector2 dist;
	double distlen;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePolyTo: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	dist = targ - poly->StartSpot.pos;
	distlen = dist.MakeUnit();
	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePolyTo(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = distlen;
		pe->m_Speed = speed;
		pe->m_Speedv = dist * speed;
		pe->m_Target = poly->StartSpot.pos + dist * distlen;
		if ((pe->m_Dist / pe->m_Speed) <= 2)
		{
			pe->StopInterpolation();
		}
		dist = -dist;	// reverse the direction
	}
	return pe != NULL; // Return true if something started moving.
}